

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMapFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  string_view terminating_string;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  FieldDescriptor *descriptor;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string_view local_48;
  FieldDescriptor *local_38;
  FieldDescriptor *value;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutableMapFieldLiteGenerator *this_local;
  
  local_20 = output;
  output_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)printer;
  printer_local = (Printer *)this;
  iVar3 = FieldDescriptor::number(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar3,local_20);
  iVar3 = GetExperimentalJavaFieldType(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar3,local_20);
  pvVar1 = output_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&value,
             "\"$name$_\",\n$default_entry$,\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)pvVar1,&this->variables_,_value);
  local_38 = MapValueField(this->descriptor_);
  bVar2 = SupportUnknownEnumValue(local_38);
  if (!bVar2) {
    JVar4 = GetJavaType(local_38);
    pvVar1 = output_local;
    if (JVar4 == JAVATYPE_ENUM) {
      descriptor = MapValueField(this->descriptor_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"$value_enum_type$");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,",\n");
      bVar2 = Context::EnforceLite(this->context_);
      terminating_string._M_str = local_58._M_str;
      terminating_string._M_len = local_58._M_len;
      PrintEnumVerifierLogic
                ((Printer *)pvVar1,descriptor,&this->variables_,local_48,terminating_string,bVar2);
    }
  }
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_,
                 "\"$name$_\",\n"
                 "$default_entry$,\n");
  const FieldDescriptor* value = MapValueField(descriptor_);
  if (!SupportUnknownEnumValue(value) && GetJavaType(value) == JAVATYPE_ENUM) {
    PrintEnumVerifierLogic(printer, MapValueField(descriptor_), variables_,
                           /*var_name=*/"$value_enum_type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}